

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::hex_writer>
          *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  ulong uVar2;
  ulong uVar3;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar4;
  char __tmp;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar5;
  ulong uVar6;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar12 = (ulong)spec->width_;
  uVar2 = f->size_;
  uVar9 = uVar2 - uVar12;
  if (uVar12 <= uVar2) {
LAB_0015aff3:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  uVar8 = uVar12 - uVar2;
  if (spec->align_ == ALIGN_CENTER) {
    uVar10 = uVar8 >> 1;
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar3 = *(ulong *)(this + 8);
    uVar9 = *(ulong *)(this + 0x10);
    bVar5 = this[0x18];
    uVar6 = uVar10;
    bVar7 = bVar5;
    if (1 < uVar8) {
      do {
        bVar5 = bVar1;
        if (uVar9 < uVar3) {
          *pbVar4 = bVar1;
          bVar5 = bVar7;
        }
        pbVar4 = pbVar4 + (uVar9 < uVar3);
        uVar9 = uVar9 + 1;
        uVar6 = uVar6 - 1;
        bVar7 = bVar5;
      } while (uVar6 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar3;
    *(ulong *)(this + 0x10) = uVar9;
    this[0x18] = bVar5;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar3 = *(ulong *)(this + 8);
    uVar9 = *(ulong *)(this + 0x10);
    bVar5 = this[0x18];
    if (uVar8 != uVar10) {
      lVar11 = (uVar2 + uVar10) - uVar12;
      bVar7 = bVar5;
      do {
        bVar5 = bVar1;
        if (uVar9 < uVar3) {
          *pbVar4 = bVar1;
          bVar5 = bVar7;
        }
        pbVar4 = pbVar4 + (uVar9 < uVar3);
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 1;
        bVar7 = bVar5;
      } while (lVar11 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar3;
    *(ulong *)(this + 0x10) = uVar9;
    this[0x18] = bVar5;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar9 = *(ulong *)(this + 0x10);
      bVar5 = this[0x18];
      if (uVar8 != 0) {
        lVar11 = uVar2 - uVar12;
        bVar7 = bVar5;
        do {
          bVar5 = bVar1;
          if (uVar9 < uVar3) {
            *pbVar4 = bVar1;
            bVar5 = bVar7;
          }
          pbVar4 = pbVar4 + (uVar9 < uVar3);
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 1;
          bVar7 = bVar5;
        } while (lVar11 != 0);
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar4;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar9;
      this[0x18] = bVar5;
      goto LAB_0015aff3;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar12 = *(ulong *)(this + 8);
    uVar2 = *(ulong *)(this + 0x10);
    bVar5 = this[0x18];
    while (uVar8 != 0) {
      bVar7 = bVar1;
      if (uVar2 < uVar12) {
        *pbVar4 = bVar1;
        bVar7 = bVar5;
      }
      pbVar4 = pbVar4 + (uVar2 < uVar12);
      uVar2 = uVar2 + 1;
      uVar9 = uVar9 + 1;
      bVar5 = bVar7;
      uVar8 = uVar9;
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar4;
    *(ulong *)(this + 8) = uVar12;
    *(ulong *)(this + 0x10) = uVar2;
    this[0x18] = bVar5;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }